

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::ConcatOrAlternate
                   (RegexpOp op,Regexp **sub,int nsub,ParseFlags flags,bool can_factor)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  Regexp **ppRVar4;
  Regexp *pRVar5;
  int local_84;
  int i_1;
  Regexp **subs;
  Regexp *re;
  int i;
  Regexp **subs_1;
  Regexp *re_2;
  int nbigsub;
  Regexp *re_1;
  Regexp **subcopy;
  int iStack_24;
  bool can_factor_local;
  ParseFlags flags_local;
  int nsub_local;
  Regexp **sub_local;
  Regexp *pRStack_10;
  RegexpOp op_local;
  
  if (nsub == 1) {
    pRStack_10 = *sub;
  }
  else if (nsub == 0) {
    if (op == kRegexpAlternate) {
      pRStack_10 = (Regexp *)operator_new(0x28);
      Regexp(pRStack_10,kRegexpNoMatch,flags);
    }
    else {
      pRStack_10 = (Regexp *)operator_new(0x28);
      Regexp(pRStack_10,kRegexpEmptyMatch,flags);
    }
  }
  else {
    re_1 = (Regexp *)0x0;
    iStack_24 = nsub;
    _flags_local = (Regexp *)sub;
    if ((op == kRegexpAlternate) && (can_factor)) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)nsub;
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      re_1 = (Regexp *)operator_new__(uVar3);
      memmove(re_1,sub,(long)nsub << 3);
      iStack_24 = FactorAlternation((Regexp **)re_1,nsub,flags);
      _flags_local = re_1;
      if (iStack_24 == 1) {
        pRVar5 = *(Regexp **)re_1;
        if (re_1 == (Regexp *)0x0) {
          return pRVar5;
        }
        operator_delete__(re_1);
        return pRVar5;
      }
    }
    if (iStack_24 < 0x10000) {
      pRStack_10 = (Regexp *)operator_new(0x28);
      Regexp(pRStack_10,op,flags);
      AllocSub(pRStack_10,iStack_24);
      ppRVar4 = Regexp::sub(pRStack_10);
      for (local_84 = 0; local_84 < iStack_24; local_84 = local_84 + 1) {
        ppRVar4[local_84] = *(Regexp **)(&_flags_local->op_ + (long)local_84 * 8);
      }
      if (re_1 != (Regexp *)0x0) {
        operator_delete__(re_1);
      }
    }
    else {
      iVar2 = (int)((ulong)((long)(iStack_24 + 0xfffe) * -0x7fff7fff) >> 0x20) + 0xfffe + iStack_24;
      iVar2 = (iVar2 >> 0xf) - (iVar2 >> 0x1f);
      pRStack_10 = (Regexp *)operator_new(0x28);
      Regexp(pRStack_10,op,flags);
      AllocSub(pRStack_10,iVar2);
      ppRVar4 = Regexp::sub(pRStack_10);
      for (re._4_4_ = 0; re._4_4_ < iVar2 + -1; re._4_4_ = re._4_4_ + 1) {
        pRVar5 = ConcatOrAlternate(op,(Regexp **)
                                      (&_flags_local->op_ + (long)(re._4_4_ * 0xffff) * 8),0xffff,
                                   flags,false);
        ppRVar4[re._4_4_] = pRVar5;
      }
      pRVar5 = ConcatOrAlternate(op,(Regexp **)
                                    (&_flags_local->op_ + (long)((iVar2 + -1) * 0xffff) * 8),
                                 iStack_24 + (iVar2 + -1) * -0xffff,flags,false);
      ppRVar4[iVar2 + -1] = pRVar5;
      if (re_1 != (Regexp *)0x0) {
        operator_delete__(re_1);
      }
    }
  }
  return pRStack_10;
}

Assistant:

Regexp* Regexp::ConcatOrAlternate(RegexpOp op, Regexp** sub, int nsub,
                                  ParseFlags flags, bool can_factor) {
  if (nsub == 1)
    return sub[0];

  if (nsub == 0) {
    if (op == kRegexpAlternate)
      return new Regexp(kRegexpNoMatch, flags);
    else
      return new Regexp(kRegexpEmptyMatch, flags);
  }

  Regexp** subcopy = NULL;
  if (op == kRegexpAlternate && can_factor) {
    // Going to edit sub; make a copy so we don't step on caller.
    subcopy = new Regexp*[nsub];
    memmove(subcopy, sub, nsub * sizeof sub[0]);
    sub = subcopy;
    nsub = FactorAlternation(sub, nsub, flags);
    if (nsub == 1) {
      Regexp* re = sub[0];
      delete[] subcopy;
      return re;
    }
  }

  if (nsub > kMaxNsub) {
    // Too many subexpressions to fit in a single Regexp.
    // Make a two-level tree.  Two levels gets us to 65535^2.
    int nbigsub = (nsub+kMaxNsub-1)/kMaxNsub;
    Regexp* re = new Regexp(op, flags);
    re->AllocSub(nbigsub);
    Regexp** subs = re->sub();
    for (int i = 0; i < nbigsub - 1; i++)
      subs[i] = ConcatOrAlternate(op, sub+i*kMaxNsub, kMaxNsub, flags, false);
    subs[nbigsub - 1] = ConcatOrAlternate(op, sub+(nbigsub-1)*kMaxNsub,
                                          nsub - (nbigsub-1)*kMaxNsub, flags,
                                          false);
    delete[] subcopy;
    return re;
  }

  Regexp* re = new Regexp(op, flags);
  re->AllocSub(nsub);
  Regexp** subs = re->sub();
  for (int i = 0; i < nsub; i++)
    subs[i] = sub[i];

  delete[] subcopy;
  return re;
}